

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

void __thiscall
slang::SmallVectorBase<slang::parsing::Token>::reallocateTo
          (SmallVectorBase<slang::parsing::Token> *this,size_type newCapacity)

{
  undefined8 *puVar1;
  pointer pTVar2;
  size_type sVar3;
  undefined8 uVar4;
  pointer pTVar5;
  long lVar6;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)newCapacity;
  pTVar5 = (pointer)operator_new(newCapacity << 4);
  pTVar2 = this->data_;
  sVar3 = this->len;
  for (lVar6 = 0; sVar3 << 4 != lVar6; lVar6 = lVar6 + 0x10) {
    ctx = (EVP_PKEY_CTX *)((long)&pTVar2->kind + lVar6);
    puVar1 = (undefined8 *)((long)&pTVar5->kind + lVar6);
    uVar4 = *(undefined8 *)(ctx + 8);
    *puVar1 = *(undefined8 *)ctx;
    puVar1[1] = uVar4;
  }
  cleanup(this,ctx);
  this->cap = newCapacity;
  this->data_ = pTVar5;
  return;
}

Assistant:

void reallocateTo(size_type newCapacity) {
        auto newData = (pointer)::operator new(newCapacity * sizeof(T));
        std::uninitialized_move(begin(), end(), newData);

        cleanup();
        cap = newCapacity;
        data_ = newData;
    }